

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng::decode(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,uint *w,uint *h,
                    uchar *in,size_t insize,LodePNGColorType colortype,uint bitdepth)

{
  uchar *__first;
  uint uVar1;
  size_t sVar2;
  uchar *buffer;
  State state;
  uchar *local_2b8;
  LodePNGState local_2b0;
  
  local_2b8 = (uchar *)0x0;
  uVar1 = lodepng_decode_memory(&local_2b8,w,h,in,insize,colortype,bitdepth);
  __first = local_2b8;
  if (uVar1 == 0 && local_2b8 != (uchar *)0x0) {
    lodepng_state_init(&local_2b0);
    local_2b0.info_raw.bitdepth = bitdepth;
    local_2b0.info_raw.colortype = colortype;
    sVar2 = lodepng_get_raw_size(*w,*h,&local_2b0.info_raw);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,
               (const_iterator)
               (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,__first,__first + sVar2);
    lodepng_state_cleanup(&local_2b0);
  }
  free(local_2b8);
  return uVar1;
}

Assistant:

unsigned decode(std::vector<unsigned char>& out, unsigned& w, unsigned& h, const unsigned char* in,
                size_t insize, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  unsigned error = lodepng_decode_memory(&buffer, &w, &h, in, insize, colortype, bitdepth);
  if(buffer && !error) {
    State state;
    state.info_raw.colortype = colortype;
    state.info_raw.bitdepth = bitdepth;
    size_t buffersize = lodepng_get_raw_size(w, h, &state.info_raw);
    out.insert(out.end(), buffer, &buffer[buffersize]);
  }
  lodepng_free(buffer);
  return error;
}